

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry_creation.cpp
# Opt level: O3

Ref<embree::SceneGraph::Node> __thiscall
embree::SceneGraph::createGarbageSubdivMesh
          (SceneGraph *this,int hash,size_t numFaces,bool mblur,
          Ref<embree::SceneGraph::MaterialNode> *material)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  pointer *ppuVar3;
  iterator iVar4;
  pointer pvVar5;
  size_t sVar6;
  Vec3fa *pVVar7;
  undefined8 uVar8;
  Node *pNVar9;
  uint uVar10;
  int iVar11;
  Vec3fa *pVVar12;
  long lVar13;
  int iVar14;
  undefined7 in_register_00000009;
  ulong uVar15;
  ulong uVar16;
  int iVar17;
  ulong uVar18;
  ulong uVar19;
  SubdivMeshNode *pSVar20;
  uint uVar21;
  uint f;
  uint local_84;
  SubdivMeshNode *local_80;
  undefined4 local_74;
  Ref<embree::SceneGraph::MaterialNode> local_70;
  uint local_64;
  size_t local_60;
  size_t local_58;
  ulong local_50;
  Node *local_48;
  vector<unsigned_int,std::allocator<unsigned_int>> *local_40;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_38;
  
  local_74 = (undefined4)CONCAT71(in_register_00000009,mblur);
  local_60 = numFaces;
  local_80 = (SubdivMeshNode *)operator_new(0x1b0);
  local_70 = (Ref<embree::SceneGraph::MaterialNode>)material->ptr;
  if (local_70.ptr != (MaterialNode *)0x0) {
    (*((local_70.ptr)->super_Node).super_RefCount._vptr_RefCount[2])();
  }
  pSVar20 = local_80;
  SubdivMeshNode::SubdivMeshNode
            (local_80,&local_70,(BBox1f)0x3f80000000000000,(ulong)(byte)local_74 + 1);
  (*(pSVar20->super_Node).super_RefCount._vptr_RefCount[2])(pSVar20);
  local_48 = (Node *)this;
  if (local_70.ptr != (MaterialNode *)0x0) {
    (*((local_70.ptr)->super_Node).super_RefCount._vptr_RefCount[3])();
  }
  if (local_60 != 0) {
    uVar10 = (uint)(hash * -0x3361d2af) >> 0x11 | hash * 0x16a88000;
    uVar10 = (uVar10 * -0x194da000 | uVar10 * 0x1b873593 >> 0x13) * 5 + 0xe6546b64;
    uVar10 = (uVar10 >> 0x10 ^ uVar10) * -0x7a143595;
    uVar10 = (uVar10 >> 0xd ^ uVar10) * -0x3d4d51cb;
    uVar10 = uVar10 >> 0x10 ^ uVar10;
    local_40 = (vector<unsigned_int,std::allocator<unsigned_int>> *)&pSVar20->verticesPerFace;
    local_38 = &pSVar20->position_indices;
    local_58 = 0;
    do {
      uVar10 = uVar10 * 0x19660d + 0x3c6ef35f;
      local_84 = (uVar10 >> 1) % 0x14;
      iVar4._M_current =
           (pSVar20->verticesPerFace).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar4._M_current ==
          (pSVar20->verticesPerFace).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>(local_40,iVar4,&local_84);
      }
      else {
        *iVar4._M_current = local_84;
        ppuVar3 = &(pSVar20->verticesPerFace).
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        *ppuVar3 = *ppuVar3 + 1;
      }
      if (local_84 != 0) {
        uVar19 = 0;
        do {
          uVar21 = uVar10 * 0x19660d + 0x3c6ef35f;
          if ((uVar21 & 0x3e) == 0) {
            uVar21 = uVar21 * 0x19660d + 0x3c6ef35f;
            local_64 = uVar21;
          }
          else {
            local_64 = (uint)((pSVar20->positions).
                              super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->size_active;
          }
          iVar4._M_current =
               (pSVar20->position_indices).
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar4._M_current ==
              (pSVar20->position_indices).
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
            _M_realloc_insert<unsigned_int>(local_38,iVar4,&local_64);
          }
          else {
            *iVar4._M_current = local_64;
            ppuVar3 = &(pSVar20->position_indices).
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_finish;
            *ppuVar3 = *ppuVar3 + 1;
          }
          pvVar5 = (pSVar20->positions).
                   super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          sVar6 = pvVar5->size_active;
          uVar15 = pvVar5->size_alloced;
          uVar16 = sVar6 + 1;
          local_50 = uVar19;
          if (uVar15 < uVar16) {
            uVar19 = uVar16;
            uVar18 = uVar15;
            if (uVar15 != 0) {
              do {
                uVar19 = uVar18 * 2 + (ulong)(uVar18 * 2 == 0);
                uVar18 = uVar19;
              } while (uVar19 < uVar16);
            }
            if (uVar15 != uVar19) {
              pVVar7 = pvVar5->items;
              pVVar12 = (Vec3fa *)alignedMalloc(uVar19 << 4,0x10);
              pvVar5->items = pVVar12;
              if (pvVar5->size_active != 0) {
                lVar13 = 0;
                uVar15 = 0;
                do {
                  puVar1 = (undefined8 *)((long)&pVVar7->field_0 + lVar13);
                  uVar8 = puVar1[1];
                  puVar2 = (undefined8 *)((long)&pvVar5->items->field_0 + lVar13);
                  *puVar2 = *puVar1;
                  puVar2[1] = uVar8;
                  uVar15 = uVar15 + 1;
                  lVar13 = lVar13 + 0x10;
                } while (uVar15 < pvVar5->size_active);
              }
              alignedFree(pVVar7);
              pvVar5->size_active = sVar6;
              pvVar5->size_alloced = uVar19;
              pSVar20 = local_80;
            }
          }
          uVar10 = uVar21 * 0x979e791 + 0xaaf95334;
          pVVar7 = pvVar5->items;
          pvVar5->size_active = uVar16;
          *(ulong *)&pVVar7[sVar6].field_0 =
               CONCAT44(uVar21 * 0x17385ca9 + 0x47502932,uVar21 * 0x19660d + 0x3c6ef35f);
          *(ulong *)((long)&pVVar7[sVar6].field_0 + 8) =
               CONCAT44(uVar10,uVar21 * -0x50b6f56b + -0x2e330917);
          if ((byte)local_74 != '\0') {
            pvVar5 = (pSVar20->positions).
                     super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            sVar6 = pvVar5[1].size_active;
            uVar16 = pvVar5[1].size_alloced;
            uVar19 = sVar6 + 1;
            if (uVar16 < uVar19) {
              uVar15 = uVar19;
              uVar18 = uVar16;
              if (uVar16 != 0) {
                do {
                  uVar15 = uVar18 * 2 + (ulong)(uVar18 * 2 == 0);
                  uVar18 = uVar15;
                } while (uVar15 < uVar19);
              }
              if (uVar16 != uVar15) {
                pVVar7 = pvVar5[1].items;
                pVVar12 = (Vec3fa *)alignedMalloc(uVar15 << 4,0x10);
                pvVar5[1].items = pVVar12;
                if (pvVar5[1].size_active != 0) {
                  lVar13 = 0;
                  uVar16 = 0;
                  do {
                    puVar1 = (undefined8 *)((long)&pVVar7->field_0 + lVar13);
                    uVar8 = puVar1[1];
                    puVar2 = (undefined8 *)((long)&(pvVar5[1].items)->field_0 + lVar13);
                    *puVar2 = *puVar1;
                    puVar2[1] = uVar8;
                    uVar16 = uVar16 + 1;
                    lVar13 = lVar13 + 0x10;
                  } while (uVar16 < pvVar5[1].size_active);
                }
                alignedFree(pVVar7);
                pvVar5[1].size_active = sVar6;
                pvVar5[1].size_alloced = uVar15;
                pSVar20 = local_80;
              }
            }
            iVar11 = uVar10 * 0x19660d;
            iVar14 = uVar10 * 0x17385ca9;
            iVar17 = uVar10 * -0x50b6f56b;
            uVar10 = uVar10 * 0x979e791 + 0xaaf95334;
            pVVar7 = pvVar5[1].items;
            pvVar5[1].size_active = uVar19;
            *(ulong *)&pVVar7[sVar6].field_0 = CONCAT44(iVar14 + 0x47502932,iVar11 + 0x3c6ef35f);
            *(ulong *)((long)&pVVar7[sVar6].field_0 + 8) = CONCAT44(uVar10,iVar17 + -0x2e330917);
          }
          uVar19 = local_50 + 1;
        } while (uVar19 < local_84);
      }
      local_58 = local_58 + 1;
    } while (local_58 != local_60);
  }
  pNVar9 = local_48;
  (local_48->super_RefCount)._vptr_RefCount = (_func_int **)pSVar20;
  (*(pSVar20->super_Node).super_RefCount._vptr_RefCount[2])(pSVar20);
  (*(pSVar20->super_Node).super_RefCount._vptr_RefCount[3])(pSVar20);
  return (Ref<embree::SceneGraph::Node>)pNVar9;
}

Assistant:

Ref<SceneGraph::Node> SceneGraph::createGarbageSubdivMesh (int hash, size_t numFaces, bool mblur, Ref<MaterialNode> material)
  {
    RandomSampler sampler;
    RandomSampler_init(sampler,hash);
    Ref<SceneGraph::SubdivMeshNode> mesh = new SceneGraph::SubdivMeshNode(material,BBox1f(0,1),mblur?2:1);

    for (size_t i=0; i<numFaces; i++) 
    {
      const unsigned f = RandomSampler_getInt(sampler) % 20;
      mesh->verticesPerFace.push_back(f);
      for (size_t j=0; j<f; j++) 
      {
        mesh->position_indices.push_back((RandomSampler_getInt(sampler) % 32 == 0) ? RandomSampler_getUInt(sampler) : unsigned(mesh->numPositions()));

        const float x = cast_i2f(RandomSampler_getUInt(sampler));
        const float y = cast_i2f(RandomSampler_getUInt(sampler));
        const float z = cast_i2f(RandomSampler_getUInt(sampler));
        const float w = cast_i2f(RandomSampler_getUInt(sampler));
        mesh->positions[0].push_back(Vec3fa(Vec3ff(x,y,z,w)));

        if (mblur) 
        {
          const float x = cast_i2f(RandomSampler_getUInt(sampler));
          const float y = cast_i2f(RandomSampler_getUInt(sampler));
          const float z = cast_i2f(RandomSampler_getUInt(sampler));
          const float w = cast_i2f(RandomSampler_getUInt(sampler));
          mesh->positions[1].push_back(Vec3fa(Vec3ff(x,y,z,w)));
        }
      }
    }

    return mesh.dynamicCast<SceneGraph::Node>();
  }